

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall CSourceFilesProcessor::processFile(CSourceFilesProcessor *this,string *fileName)

{
  CScanner *this_00;
  ifstream *piVar1;
  byte bVar2;
  long *plVar3;
  char c;
  string local_40;
  
  piVar1 = &this->file;
  std::ifstream::open((string *)piVar1,(_Ios_Openmode)fileName);
  this_00 = &this->scanner;
  Refal2::CError::SetFileName((CError *)this_00,fileName);
  if (*(int *)(&this->field_0x1fb8 + *(long *)(*(long *)&this->file + -0x18)) == 0) {
    plVar3 = (long *)std::istream::get((char *)piVar1);
    bVar2 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
    while ((bVar2 & 5) == 0) {
      Refal2::CScanner::AddChar(this_00,(char)local_40._M_dataplus._M_p);
      plVar3 = (long *)std::istream::get((char *)piVar1);
      bVar2 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
    }
    if (*(TErrorSeverity *)
         ((long)&(this->scanner).super_CParser.super_CDirectiveParser.super_CRuleParser.
                 super_CQualifierParser.super_CModuleBuilder.super_CProgramBuilder + 0xa0) !=
        ES_FatalError) {
      Refal2::CScanner::AddEndOfFile(this_00);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"no such file","");
    Refal2::CErrorsHelper::RaiseError((CErrorsHelper *)this_00,ES_FatalError,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  Refal2::CError::ResetFileName((CError *)this_00);
  std::ifstream::close();
  return;
}

Assistant:

void CSourceFilesProcessor::processFile( const std::string& fileName )
{
	file.open( fileName );
	scanner.SetFileName( fileName );
	if( file.good() ) {
		for( char c; file.get( c ); ) {
			scanner.AddChar( c );
		}
		if( scanner.ErrorSeverity() != ES_FatalError ) {
			scanner.AddEndOfFile();
		}
	} else {
		scanner.RaiseError( ES_FatalError, "no such file" );
	}
	scanner.ResetFileName();
	file.close();
}